

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O1

Vec3fa __thiscall
embree::renderPixel(embree *this,TutorialData *data,float x,float y,ISPCCamera *camera,
                   RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ISPCType IVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar18;
  undefined1 auVar10 [16];
  undefined8 uVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  float fVar26;
  float fVar28;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 extraout_XMM1_Qa;
  float fVar27;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar23 [16];
  float fVar32;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar33;
  float fVar34;
  float fVar43;
  vfloat4 a_1;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  vfloat4 a;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  Vec3fa VVar63;
  Vec3fa T;
  RayQueryContext context;
  float local_298;
  float local_294;
  float local_288;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [48];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  float local_178;
  float fStack_174;
  float fStack_170;
  undefined4 local_164;
  uint uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined1 local_148 [16];
  undefined8 local_138;
  ulong uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  RayQueryContext local_d0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined4 local_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 local_50;
  RayQueryContext *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 auVar36 [16];
  undefined1 auVar54 [16];
  
  uVar5 = (int)y << 0x10 | (int)x;
  uVar5 = uVar5 * -0x3361d2af >> 0x11 | uVar5 * 0x16a88000;
  uVar5 = (data->accu_count * -0x3361d2af >> 0x11 | data->accu_count * 0x16a88000) * 0x1b873593 ^
          (uVar5 * -0x194da000 | uVar5 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar5 = (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
  uVar5 = (uVar5 >> 0x10 ^ uVar5) * -0x7a143595;
  uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
  uVar5 = uVar5 >> 0x10 ^ uVar5;
  local_48 = &local_d0;
  local_d0.context.instID[0] = 0xffffffff;
  local_d0.context.instPrimID[0] = 0xffffffff;
  uVar6 = 0;
  local_d0.userRayExt = (void *)0x0;
  _local_228 = ZEXT816(0);
  uStack_40 = 0;
  local_38 = 0;
  local_50 = 0x100004200000000;
  uVar7 = uVar5 * -0x50b6f56b + 0xd1ccf6e9;
  fVar8 = x + (float)(uVar5 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
  fVar18 = y + (float)(uVar5 * 0x17385ca9 + 0x47502932 >> 1) * 4.656613e-10;
  local_108 = (float)(uVar7 >> 1) * 4.656613e-10;
  auVar52._4_4_ = (camera->xfm).l.vy.field_0.field_0.x * fVar18;
  local_198 = auVar52._4_4_ + (camera->xfm).l.vx.field_0.field_0.x * fVar8 +
              (camera->xfm).l.vz.field_0.field_0.x;
  uVar19 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fStack_194 = (float)uVar2 + fVar18 * (float)uVar1 + fVar8 * (float)uVar19;
  fVar8 = (float)((ulong)uVar2 >> 0x20) +
          fVar18 * (float)((ulong)uVar1 >> 0x20) + fVar8 * (float)((ulong)uVar19 >> 0x20);
  auVar53._4_4_ = auVar52._4_4_;
  auVar53._0_4_ = local_198;
  auVar53._8_4_ = auVar52._4_4_;
  auVar53._12_4_ = auVar52._4_4_;
  auVar10._4_12_ = auVar53._4_12_;
  auVar10._0_4_ = local_198 * local_198 + fStack_194 * fStack_194 + fVar8 * fVar8;
  auVar52._0_4_ = auVar10._0_4_;
  auVar52._8_4_ = auVar52._4_4_;
  auVar52._12_4_ = auVar52._4_4_;
  auVar53 = rsqrtss(auVar52,auVar10);
  fVar18 = auVar53._0_4_;
  fStack_190 = fVar18 * fVar18 * auVar10._0_4_ * -0.5 * fVar18 + fVar18 * 1.5;
  local_198 = local_198 * fStack_190;
  fStack_194 = fStack_190 * fStack_194;
  fStack_190 = fStack_190 * fVar8;
  fStack_1a0 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_1a8 = (undefined1  [8])*(undefined8 *)&(camera->xfm).p.field_0;
  uStack_19c = 0;
  fStack_18c = 0.0;
  local_188 = 0xffffffff7f800000;
  local_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  uStack_158 = 0xffffffff;
  _local_268 = *(undefined1 (*) [16])this;
  local_208._8_8_ = 0x3f8000003f800000;
  local_208._0_8_ = 0x3f8000003f800000;
  local_f8 = local_108;
  fStack_f4 = local_108;
  fStack_f0 = local_108;
  fStack_ec = local_108;
  local_d0.tutorialData = data;
  do {
    fVar18 = local_208._0_4_;
    fVar26 = local_208._4_4_;
    fVar28 = local_208._8_4_;
    uVar19 = local_208._8_8_;
    fVar8 = fVar26;
    if (fVar26 <= fVar18) {
      fVar8 = fVar18;
    }
    auVar21._8_8_ = uVar19;
    auVar21._0_8_ = uVar19;
    if (fVar28 <= fVar8) {
      auVar22._4_12_ = auVar21._4_12_;
      auVar22._0_4_ = fVar8;
      uVar19 = auVar22._0_8_;
    }
    if (((float)uVar19 < 0.01) || (0x14 < uVar6)) {
LAB_00120834:
      local_268._4_4_ = local_228._4_4_;
      local_268._0_4_ = local_228._0_4_;
      uStack_260._0_4_ = fStack_220;
      uStack_260._4_4_ = fStack_21c;
      break;
    }
    rtcTraversableIntersect1(data->traversable,local_1a8,&local_50);
    stats->numRays = stats->numRays + 1;
    if ((ulong)uStack_160 == 0xffffffff) {
      *(undefined1 (*) [8])this = local_268;
      *(undefined8 *)(this + 8) = uStack_260;
      fVar18 = fVar18 * (data->ambient_intensity).field_0.m128[0];
      fVar26 = fVar26 * (data->ambient_intensity).field_0.m128[1];
      uVar19 = CONCAT44(fVar26,fVar18);
      local_228._0_4_ = (float)local_228._0_4_ + fVar18;
      local_228._4_4_ = (float)local_228._4_4_ + fVar26;
      fStack_220 = fStack_220 + fVar28 * (data->ambient_intensity).field_0.m128[2];
      fStack_21c = fStack_21c + (float)local_208._12_4_ * (data->ambient_intensity).field_0.m128[3];
      goto LAB_00120834;
    }
    IVar3 = data->ispc_scene->geometries[uStack_160]->type;
    if (IVar3 == TRIANGLE_MESH) {
      if (0.0 < fStack_170 * fStack_190 + fStack_174 * fStack_194 + local_178 * local_198) {
        local_178 = -local_178;
        fStack_174 = -fStack_174;
        fStack_170 = -fStack_170;
      }
      fVar50 = local_178 * local_178 + fStack_174 * fStack_174 + fStack_170 * fStack_170;
      auVar53 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
      fVar8 = auVar53._0_4_;
      fVar8 = fVar8 * 1.5 - fVar8 * fVar8 * fVar50 * 0.5 * fVar8;
      fVar27 = local_178 * fVar8;
      fVar50 = fVar8 * fStack_174;
      fVar8 = fVar8 * fStack_170;
      local_238 = 0;
      uStack_230 = 0;
      local_1b8._4_4_ = fVar50;
      local_1b8._0_4_ = fVar27;
      fStack_1b0 = fVar8;
      fStack_1ac = 0.0;
      fStack_1c0 = fStack_194 * fVar27 - local_198 * fVar50;
      local_1c8._0_4_ = fStack_190 * fVar50 - fStack_194 * fVar8;
      local_1c8._4_4_ = local_198 * fVar8 - fStack_190 * fVar27;
      fVar30 = fStack_18c * 0.0 - fStack_18c * 0.0;
      fVar20 = (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
      fVar29 = (float)local_1c8._4_4_ * (float)local_1c8._4_4_;
      fVar31 = fVar30 * fVar30;
      fVar51 = fVar29 + fVar20 + fStack_1c0 * fStack_1c0;
      auVar55._0_8_ = CONCAT44(fVar31 + fVar20 + fVar20,fVar51);
      auVar55._8_4_ = fVar29 + fVar20 + fVar29;
      auVar55._12_4_ = fVar31 + fVar20 + fVar31;
      auVar35._8_4_ = auVar55._8_4_;
      auVar35._0_8_ = auVar55._0_8_;
      auVar35._12_4_ = auVar55._12_4_;
      auVar53 = rsqrtss(auVar35,auVar55);
      fVar20 = auVar53._0_4_;
      fStack_1bc = fVar20 * 1.5 - fVar20 * fVar20 * fVar51 * 0.5 * fVar20;
      local_1c8._0_4_ = fStack_1bc * (float)local_1c8._0_4_;
      local_1c8._4_4_ = fStack_1bc * (float)local_1c8._4_4_;
      fStack_1c0 = fStack_1bc * fStack_1c0;
      fStack_1bc = fStack_1bc * fVar30;
      fStack_1d0 = (float)local_1c8._4_4_ * fVar27 - fVar50 * (float)local_1c8._0_4_;
      local_1d8 = fStack_1c0 * fVar50 - fVar8 * (float)local_1c8._4_4_;
      fStack_1d4 = (float)local_1c8._0_4_ * fVar8 - fVar27 * fStack_1c0;
      fVar27 = fStack_1bc * 0.0 - fStack_1bc * 0.0;
      fVar8 = local_1d8 * local_1d8;
      fVar50 = fStack_1d4 * fStack_1d4;
      fVar20 = fVar27 * fVar27;
      fVar29 = fVar50 + fVar8 + fStack_1d0 * fStack_1d0;
      auVar46._0_8_ = CONCAT44(fVar20 + fVar8 + fVar8,fVar29);
      auVar46._8_4_ = fVar50 + fVar8 + fVar50;
      auVar46._12_4_ = fVar20 + fVar8 + fVar20;
      auVar12._8_4_ = auVar46._8_4_;
      auVar12._0_8_ = auVar46._0_8_;
      auVar12._12_4_ = auVar46._12_4_;
      auVar53 = rsqrtss(auVar12,auVar46);
      fVar8 = auVar53._0_4_;
      fStack_1cc = fVar8 * 1.5 - fVar8 * fVar8 * fVar29 * 0.5 * fVar8;
      local_1d8 = fStack_1cc * local_1d8;
      fStack_1d4 = fStack_1cc * fStack_1d4;
      fStack_1d0 = fStack_1cc * fStack_1d0;
      fStack_1cc = fStack_1cc * fVar27;
      local_118._0_12_ = ZEXT812(0x3f800000);
      local_118._12_4_ = 0;
      local_294 = 1.0;
      local_298 = 1.0;
      local_128._0_12_ = ZEXT812(0x3ea2f983);
      local_288 = 0.4774648;
      local_218 = 0x3f8000003f800000;
      uStack_210 = 0x3f8000003f800000;
LAB_0011fefd:
      local_128._12_4_ = 0;
      local_b8.m128[0] = (float)local_188 * local_198 + (float)local_1a8._0_4_;
      local_b8.m128[1] = (float)local_188 * fStack_194 + (float)local_1a8._4_4_;
      local_b8.m128[2] = (float)local_188 * fStack_190 + fStack_1a0;
      local_a8 = -(data->dirlight_direction).field_0.m128[0];
      fStack_a4 = -(data->dirlight_direction).field_0.m128[1];
      fStack_a0 = -(data->dirlight_direction).field_0.m128[2];
      local_b8.m128[3] = 0.0001;
      fStack_9c = fStack_ec;
      local_98 = 0xffffffff7f800000;
      local_74 = 0xffffffff;
      uStack_70 = 0xffffffff;
      uStack_6c = 0xffffffff;
      uStack_68 = 0xffffffff;
      occluded((embree *)&local_e8,data->traversable,&local_d0,(Ray *)&local_b8.field_1);
      stats->numRays = stats->numRays + 1;
      fVar8 = -(data->dirlight_direction).field_0.m128[0];
      fVar50 = -(data->dirlight_direction).field_0.m128[1];
      fVar27 = -(data->dirlight_direction).field_0.m128[2];
      fVar20 = -(data->dirlight_direction).field_0.m128[3];
      fVar29 = (float)local_1b8._4_4_ * fVar50 + (float)local_1b8._0_4_ * fVar8 +
               fStack_1b0 * fVar27;
      if (fVar29 <= 0.0) {
        fVar51 = fVar29 + fVar29;
        fVar30 = (fVar51 * (float)local_1b8._0_4_ - fVar8) + -local_198;
        fVar50 = (fVar51 * (float)local_1b8._4_4_ - fVar50) + -fStack_194;
        fVar31 = (fVar51 * fStack_1b0 - fVar27) + -fStack_190;
        fVar43 = (fVar51 * fStack_1ac - fVar20) + -fStack_18c;
        fVar8 = fVar50 * fVar50;
        fVar27 = fVar31 * fVar31;
        fVar20 = fVar43 * fVar43;
        fVar51 = fVar8 + fVar30 * fVar30 + fVar27;
        auVar24._0_8_ = CONCAT44(fVar8 + fVar8 + fVar20,fVar51);
        auVar24._8_4_ = fVar8 + fVar27 + fVar27;
        auVar24._12_4_ = fVar8 + fVar20 + fVar20;
        auVar14._8_4_ = auVar24._8_4_;
        auVar14._0_8_ = auVar24._0_8_;
        auVar14._12_4_ = auVar24._12_4_;
        auVar53 = rsqrtss(auVar14,auVar24);
        fVar8 = auVar53._0_4_;
        fVar8 = fVar8 * fVar8 * fVar51 * -0.5 * fVar8 + fVar8 * 1.5;
        fVar30 = fVar8 * fVar30;
        fVar50 = fVar8 * fVar50;
        fVar31 = fVar8 * fVar31;
        fVar27 = (float)local_1c8._4_4_ * fVar50;
        fVar20 = fStack_1c0 * fVar31;
        fVar33 = fStack_1bc * fVar8 * fVar43;
        fVar32 = fVar27 + (float)local_1c8._0_4_ * fVar30 + fVar20;
        fVar34 = fVar27 + fVar27 + fVar33;
        fVar20 = fVar27 + fVar20 + fVar20;
        fVar33 = fVar27 + fVar33 + fVar33;
        fVar27 = fStack_1d4 * fVar50;
        fVar51 = fStack_1d0 * fVar31;
        fStack_1cc = fStack_1cc * fVar8 * fVar43;
        fVar8 = fVar27 + local_1d8 * fVar30 + fVar51;
        fVar43 = fVar27 + fVar27 + fStack_1cc;
        fVar51 = fVar27 + fVar51 + fVar51;
        fStack_1cc = fVar27 + fStack_1cc + fStack_1cc;
        fVar32 = fVar32 * fVar32;
        fVar8 = fVar8 * fVar8;
        auVar57._0_4_ = fVar32 + fVar8;
        auVar57._4_4_ = fVar34 * fVar34 + fVar43 * fVar43;
        auVar57._8_4_ = fVar20 * fVar20 + fVar51 * fVar51;
        auVar57._12_4_ = fVar33 * fVar33 + fStack_1cc * fStack_1cc;
        if ((auVar57._0_4_ != 0.0) || (fVar20 = local_288, NAN(auVar57._0_4_))) {
          auVar48._4_4_ = auVar57._4_4_;
          auVar48._0_4_ = auVar57._0_4_;
          auVar48._8_4_ = auVar57._8_4_;
          auVar48._12_4_ = auVar57._12_4_;
          auVar53 = rcpss(auVar48,auVar57);
          fVar20 = powf(ABS(fVar31 * fStack_1b0 +
                            fVar50 * (float)local_1b8._4_4_ + fVar30 * (float)local_1b8._0_4_),
                        (2.0 - auVar57._0_4_ * auVar53._0_4_) * auVar53._0_4_ *
                        (fVar32 * local_294 + fVar8 * local_298));
          fVar20 = fVar20 * local_288;
        }
        fVar8 = fVar20 * (float)local_238;
        fVar50 = fVar20 * local_238._4_4_;
        fVar27 = fVar20 * (float)uStack_230;
        fVar20 = fVar20 * uStack_230._4_4_;
        fVar29 = ABS(fVar29);
      }
      else {
        fVar8 = -local_198 + fVar8;
        fVar50 = -fStack_194 + fVar50;
        fVar27 = -fStack_190 + fVar27;
        fVar20 = -fStack_18c + fVar20;
        fVar30 = fVar50 * fVar50;
        fVar31 = fVar27 * fVar27;
        fVar51 = fVar20 * fVar20;
        fVar33 = fVar30 + fVar8 * fVar8 + fVar31;
        auVar36._0_8_ = CONCAT44(fVar30 + fVar30 + fVar51,fVar33);
        auVar36._8_4_ = fVar30 + fVar31 + fVar31;
        auVar36._12_4_ = fVar30 + fVar51 + fVar51;
        auVar13._8_4_ = auVar36._8_4_;
        auVar13._0_8_ = auVar36._0_8_;
        auVar13._12_4_ = auVar36._12_4_;
        auVar53 = rsqrtss(auVar13,auVar36);
        fVar30 = auVar53._0_4_;
        fVar30 = fVar30 * fVar30 * fVar33 * -0.5 * fVar30 + fVar30 * 1.5;
        fVar8 = fVar30 * fVar8;
        fVar50 = fVar30 * fVar50;
        fVar27 = fVar30 * fVar27;
        fVar31 = (float)local_1c8._4_4_ * fVar50;
        fVar51 = fStack_1c0 * fVar27;
        fVar32 = fStack_1bc * fVar30 * fVar20;
        fVar34 = fVar31 + (float)local_1c8._0_4_ * fVar8 + fVar51;
        fVar43 = fVar31 + fVar31 + fVar32;
        fVar51 = fVar31 + fVar51 + fVar51;
        fVar32 = fVar31 + fVar32 + fVar32;
        fVar31 = fStack_1d4 * fVar50;
        fVar33 = fStack_1d0 * fVar27;
        fStack_1cc = fStack_1cc * fVar30 * fVar20;
        fVar30 = fVar31 + local_1d8 * fVar8 + fVar33;
        fVar20 = fVar31 + fVar31 + fStack_1cc;
        fVar33 = fVar31 + fVar33 + fVar33;
        fStack_1cc = fVar31 + fStack_1cc + fStack_1cc;
        fVar34 = fVar34 * fVar34;
        fVar30 = fVar30 * fVar30;
        auVar56._0_4_ = fVar34 + fVar30;
        auVar56._4_4_ = fVar43 * fVar43 + fVar20 * fVar20;
        auVar56._8_4_ = fVar51 * fVar51 + fVar33 * fVar33;
        auVar56._12_4_ = fVar32 * fVar32 + fStack_1cc * fStack_1cc;
        if ((auVar56._0_4_ != 0.0) || (fVar20 = local_288, NAN(auVar56._0_4_))) {
          auVar47._4_4_ = auVar56._4_4_;
          auVar47._0_4_ = auVar56._0_4_;
          auVar47._8_4_ = auVar56._8_4_;
          auVar47._12_4_ = auVar56._12_4_;
          auVar53 = rcpss(auVar47,auVar56);
          fVar20 = powf(ABS(fVar27 * fStack_1b0 +
                            fVar50 * (float)local_1b8._4_4_ + fVar8 * (float)local_1b8._0_4_),
                        (2.0 - auVar56._0_4_ * auVar53._0_4_) * auVar53._0_4_ *
                        (fVar34 * local_294 + fVar30 * local_298));
          fVar20 = fVar20 * local_288;
        }
        fVar8 = fVar20 * (float)local_218;
        fVar50 = fVar20 * local_218._4_4_;
        fVar27 = fVar20 * (float)uStack_210;
        fVar20 = fVar20 * uStack_210._4_4_;
      }
      fVar31 = fVar29 * fVar8 * fVar18 * local_e8;
      fVar51 = fVar29 * fVar50 * fVar26 * fStack_e4;
      fVar33 = fVar29 * fVar27 * fVar28 * fStack_e0;
      fVar32 = fVar29 * fVar20 * (float)local_208._12_4_ * fStack_dc;
      fVar8 = (data->dirlight_intensity).field_0.m128[0];
      fVar50 = (data->dirlight_intensity).field_0.m128[1];
      fVar27 = (data->dirlight_intensity).field_0.m128[2];
      fVar20 = (data->dirlight_intensity).field_0.m128[3];
      local_138 = CONCAT44(fStack_194,local_198);
      uStack_130 = CONCAT44(fStack_18c,fStack_190);
      fVar29 = (float)(uVar7 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10 * 6.2831855;
      fVar30 = local_294 + 1.0;
      if (fVar30 < 0.0) {
        fVar30 = sqrtf(fVar30);
      }
      else {
        fVar30 = SQRT(fVar30);
      }
      fVar34 = sinf(fVar29);
      fVar43 = local_298 + 1.0;
      if (fVar43 < 0.0) {
        local_148._0_4_ = fVar34;
        fVar43 = sqrtf(fVar43);
        fVar34 = (float)local_148._0_4_;
      }
      else {
        fVar43 = SQRT(fVar43);
      }
      fVar30 = fVar30 * fVar34;
      fVar29 = cosf(fVar29);
      fVar29 = fVar29 * fVar43;
      auVar37._4_4_ = extraout_var._0_4_;
      auVar37._0_4_ = fVar29;
      auVar37._8_4_ = extraout_var._4_4_;
      auVar37._12_4_ = extraout_var._8_4_;
      auVar38._4_12_ = auVar37._4_12_;
      auVar38._0_4_ = fVar29 * fVar29 + fVar30 * fVar30;
      auVar49._4_4_ = extraout_var._0_4_;
      auVar49._0_4_ = auVar38._0_4_;
      auVar49._8_4_ = extraout_var._4_4_;
      auVar49._12_4_ = extraout_var._8_4_;
      auVar53 = rsqrtss(auVar49,auVar38);
      fVar34 = auVar53._0_4_;
      fVar43 = fVar34 * fVar34 * auVar38._0_4_ * -0.5 * fVar34 + fVar34 * 1.5;
      fVar30 = fVar30 * fVar43;
      fVar43 = fVar43 * fVar29;
      local_148._0_4_ = fVar43 * fVar43 * local_294 + fVar30 * fVar30 * local_298;
      local_148._4_12_ = auVar53._4_12_;
      auVar15._4_4_ = auVar53._4_4_;
      auVar15._0_4_ = local_148._0_4_;
      auVar15._8_4_ = auVar53._8_4_;
      auVar15._12_4_ = auVar53._12_4_;
      auVar16._4_12_ = auVar15._4_12_;
      auVar16._0_4_ = (float)local_148._0_4_ + 1.0;
      auVar39._4_4_ = auVar53._4_4_;
      auVar39._0_4_ = auVar16._0_4_;
      auVar39._8_4_ = auVar53._8_4_;
      auVar39._12_4_ = auVar53._12_4_;
      auVar53 = rcpss(auVar39,auVar16);
      fVar34 = powf((float)(uVar7 * 0x17385ca9 + 0x47502932 >> 1) * 4.656613e-10,
                    (2.0 - auVar16._0_4_ * auVar53._0_4_) * auVar53._0_4_);
      fVar29 = 1.0 - fVar34 * fVar34;
      if (fVar29 <= 0.0) {
        fVar29 = 0.0;
      }
      if (fVar29 < 0.0) {
        fVar29 = sqrtf(fVar29);
      }
      else {
        fVar29 = SQRT(fVar29);
      }
      uVar7 = uVar7 * -0x50b6f56b + 0xd1ccf6e9;
      local_138 = local_138 ^ 0x8000000080000000;
      uStack_130 = uStack_130 ^ 0x8000000080000000;
      fVar9 = powf(fVar34,(float)local_148._0_4_);
      fVar9 = (float)local_128._0_4_ * fVar9;
      fVar43 = fVar43 * fVar29;
      fVar30 = fVar30 * fVar29;
      fVar60 = fVar34 * (float)local_1b8._0_4_ +
               fVar30 * local_1d8 + fVar43 * (float)local_1c8._0_4_;
      fVar61 = fVar34 * (float)local_1b8._4_4_ +
               fVar30 * fStack_1d4 + fVar43 * (float)local_1c8._4_4_;
      fVar43 = fVar34 * fStack_1b0 + fVar30 * fStack_1d0 + fVar43 * fStack_1c0;
      fVar34 = fVar43 * (float)uStack_130 + fVar61 * local_138._4_4_ + fVar60 * (float)local_138;
      fVar34 = fVar34 + fVar34;
      fVar29 = fVar34 * fVar60 - (float)local_138;
      fVar30 = fVar34 * fVar61 - local_138._4_4_;
      fVar34 = fVar34 * fVar43 - (float)uStack_130;
      if ((float)local_118._0_4_ <= (float)(uVar7 >> 1) * 4.656613e-10) {
        fVar44 = fStack_1b0 * fVar34 +
                 (float)local_1b8._4_4_ * fVar30 + (float)local_1b8._0_4_ * fVar29;
        fVar44 = fVar44 + fVar44;
        fVar29 = fVar44 * (float)local_1b8._0_4_ - fVar29;
        fVar30 = fVar44 * (float)local_1b8._4_4_ - fVar30;
        fVar34 = fVar44 * fStack_1b0 - fVar34;
        fVar44 = (1.0 - (float)local_118._0_4_) * fVar9;
        fVar62 = fStack_1b0 * fVar34 +
                 (float)local_1b8._4_4_ * fVar30 + (float)local_1b8._0_4_ * fVar29;
        fVar58 = fStack_1c0 * fVar43 +
                 (float)local_1c8._4_4_ * fVar61 + (float)local_1c8._0_4_ * fVar60;
        fVar58 = fVar58 * fVar58;
        fVar59 = fStack_1d0 * fVar43 + fStack_1d4 * fVar61 + local_1d8 * fVar60;
        fVar59 = fVar59 * fVar59;
        auVar42._4_4_ = fStack_1bc * fVar9;
        auVar42._0_4_ = fVar58;
        auVar42._8_4_ = fStack_1c0 * fVar43;
        auVar42._12_4_ = fStack_1bc * fVar9;
        auVar41._4_12_ = auVar42._4_12_;
        auVar41._0_4_ = fVar58 + fVar59;
        local_218 = local_238;
        uStack_210 = uStack_230;
        if ((auVar41._0_4_ != 0.0) || (NAN(auVar41._0_4_))) goto LAB_00120652;
      }
      else {
        fVar44 = (float)local_118._0_4_ * fVar9;
        fVar62 = fStack_1b0 * fVar34 +
                 (float)local_1b8._4_4_ * fVar30 + (float)local_1b8._0_4_ * fVar29;
        fVar58 = fStack_1c0 * fVar43 +
                 (float)local_1c8._4_4_ * fVar61 + (float)local_1c8._0_4_ * fVar60;
        fVar58 = fVar58 * fVar58;
        fVar59 = fStack_1d0 * fVar43 + fStack_1d4 * fVar61 + local_1d8 * fVar60;
        fVar59 = fVar59 * fVar59;
        auVar40._4_4_ = fStack_1bc * fVar9;
        auVar40._0_4_ = fVar58;
        auVar40._8_4_ = fStack_1c0 * fVar43;
        auVar40._12_4_ = fStack_1bc * fVar9;
        auVar41._4_12_ = auVar40._4_12_;
        auVar41._0_4_ = fVar58 + fVar59;
        if ((auVar41._0_4_ != 0.0) || (NAN(auVar41._0_4_))) {
LAB_00120652:
          auVar53 = rcpss(auVar41,auVar41);
          fVar43 = powf(ABS(fVar43 * fStack_1b0 +
                            fVar61 * (float)local_1b8._4_4_ + fVar60 * (float)local_1b8._0_4_),
                        (2.0 - auVar41._0_4_ * auVar53._0_4_) * auVar53._0_4_ *
                        (local_294 * fVar58 + local_298 * fVar59));
          local_288 = local_288 * fVar43;
          local_238 = local_218;
          uStack_230 = uStack_210;
        }
        else {
          local_238 = local_218;
          uStack_230 = uStack_210;
        }
      }
      local_228 = CONCAT44((float)local_228._4_4_ + fVar51 * fVar50,
                           (float)local_228._0_4_ + fVar31 * fVar8);
      fStack_220 = fStack_220 + fVar33 * fVar27;
      fStack_21c = fStack_21c + fVar32 * fVar20;
      auVar17._4_4_ = fVar44;
      auVar17._0_4_ = fVar44;
      auVar17._8_4_ = fVar44;
      auVar17._12_4_ = fVar44;
      bVar4 = 0.0 < fVar44;
      uVar19 = local_228;
      auVar53 = _local_228;
      if (bVar4) {
        fVar8 = *(float *)(&DAT_0024ecc0 +
                          (ulong)(fStack_1b0 * fVar34 +
                                  (float)local_1b8._4_4_ * fVar30 + (float)local_1b8._0_4_ * fVar29
                                 < 0.0) * 4);
        local_1a8._4_4_ =
             fVar8 * (float)local_1b8._4_4_ + (float)local_188 * fStack_194 + (float)local_1a8._4_4_
        ;
        local_1a8._0_4_ =
             fVar8 * (float)local_1b8._0_4_ + (float)local_188 * local_198 + (float)local_1a8._0_4_;
        fStack_1a0 = fVar8 * fStack_1b0 + (float)local_188 * fStack_190 + fStack_1a0;
        uStack_19c = 0x3a83126f;
        local_188 = 0xffffffff7f800000;
        local_164 = 0xffffffff;
        uStack_160 = 0xffffffff;
        fStack_18c = local_108;
        auVar25._0_4_ = fVar18 * (float)local_238 * local_288 * ABS(fVar62);
        auVar25._4_4_ = fVar26 * local_238._4_4_ * local_288 * ABS(fVar62);
        auVar25._8_4_ = fVar28 * (float)uStack_230 * local_288 * ABS(fVar62);
        auVar25._12_4_ = (float)local_208._12_4_ * uStack_230._4_4_ * local_288 * ABS(fVar62);
        local_208._0_16_ = divps(auVar25,auVar17);
        uVar6 = uVar6 + 1;
        uVar19 = local_208._0_8_;
        auVar53 = _local_268;
        local_198 = fVar29;
        fStack_194 = fVar30;
        fStack_190 = fVar34;
      }
    }
    else {
      if (IVar3 == CURVES) {
        fVar50 = local_178 * local_178 + fStack_174 * fStack_174 + fStack_170 * fStack_170;
        auVar53 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
        fVar8 = auVar53._0_4_;
        fVar8 = fVar8 * 1.5 - fVar8 * fVar8 * fVar50 * 0.5 * fVar8;
        fVar20 = local_178 * fVar8;
        fVar50 = fVar8 * fStack_174;
        fVar8 = fVar8 * fStack_170;
        fStack_1d0 = local_198 * fVar50 - fStack_194 * fVar20;
        local_1d8 = fStack_194 * fVar8 - fStack_190 * fVar50;
        fStack_1d4 = fStack_190 * fVar20 - local_198 * fVar8;
        fVar30 = fStack_18c * 0.0 - fStack_18c * 0.0;
        fVar27 = local_1d8 * local_1d8;
        fVar29 = fStack_1d4 * fStack_1d4;
        fVar31 = fVar30 * fVar30;
        fVar51 = fVar29 + fVar27 + fStack_1d0 * fStack_1d0;
        auVar54._0_8_ = CONCAT44(fVar31 + fVar27 + fVar27,fVar51);
        auVar54._8_4_ = fVar29 + fVar27 + fVar29;
        auVar54._12_4_ = fVar31 + fVar27 + fVar31;
        auVar23._8_4_ = auVar54._8_4_;
        auVar23._0_8_ = auVar54._0_8_;
        auVar23._12_4_ = auVar54._12_4_;
        auVar53 = rsqrtss(auVar23,auVar54);
        fVar27 = auVar53._0_4_;
        fStack_1cc = fVar27 * 1.5 - fVar27 * fVar27 * fVar51 * 0.5 * fVar27;
        local_1d8 = fStack_1cc * local_1d8;
        fStack_1d4 = fStack_1cc * fStack_1d4;
        fStack_1d0 = fStack_1cc * fStack_1d0;
        fStack_1cc = fStack_1cc * fVar30;
        local_1c8._4_4_ = fVar50;
        local_1c8._0_4_ = fVar20;
        fStack_1c0 = fVar8;
        fStack_1bc = 0.0;
        fVar27 = fVar50 * local_1d8 - fStack_1d4 * fVar20;
        fVar50 = fVar8 * fStack_1d4 - fStack_1d0 * fVar50;
        fVar20 = fVar20 * fStack_1d0 - local_1d8 * fVar8;
        fVar30 = fStack_1cc * 0.0 - fStack_1cc * 0.0;
        fVar8 = fVar50 * fVar50;
        fVar29 = fVar20 * fVar20;
        fVar31 = fVar30 * fVar30;
        fVar51 = fVar29 + fVar8 + fVar27 * fVar27;
        auVar45._0_8_ = CONCAT44(fVar31 + fVar8 + fVar8,fVar51);
        auVar45._8_4_ = fVar29 + fVar8 + fVar29;
        auVar45._12_4_ = fVar31 + fVar8 + fVar31;
        auVar11._8_4_ = auVar45._8_4_;
        auVar11._0_8_ = auVar45._0_8_;
        auVar11._12_4_ = auVar45._12_4_;
        auVar53 = rsqrtss(auVar11,auVar45);
        fVar8 = auVar53._0_4_;
        fVar8 = fVar8 * 1.5 - fVar8 * fVar8 * fVar51 * 0.5 * fVar8;
        local_1b8._4_4_ = fVar8 * fVar20;
        local_1b8._0_4_ = fVar8 * fVar50;
        fStack_1b0 = fVar8 * fVar27;
        fStack_1ac = fVar8 * fVar30;
        local_238 = *(undefined8 *)&(data->hair_Kt).field_0;
        uStack_230 = *(undefined8 *)((long)&(data->hair_Kt).field_0 + 8);
        fVar50 = (data->hair_Kr).field_0.m128[1];
        fVar8 = (data->hair_Kr).field_0.m128[0];
        if (fVar50 <= fVar8) {
          fVar50 = fVar8;
        }
        fVar8 = (data->hair_Kr).field_0.m128[2];
        if (fVar8 <= fVar50) {
          fVar8 = fVar50;
        }
        fVar27 = (data->hair_Kt).field_0.m128[1];
        fVar50 = (data->hair_Kt).field_0.m128[0];
        if (fVar27 <= fVar50) {
          fVar27 = fVar50;
        }
        fVar50 = (data->hair_Kt).field_0.m128[2];
        if (fVar50 <= fVar27) {
          fVar50 = fVar27;
        }
        local_118 = ZEXT416((uint)(fVar8 / (fVar50 + fVar8)));
        local_218 = *(undefined8 *)&(data->hair_Kr).field_0;
        uStack_210 = *(undefined8 *)((long)&(data->hair_Kr).field_0 + 8);
        local_294 = 20.0;
        local_298 = 2.0;
        local_128._0_12_ = ZEXT812(0x3fa1b247);
        local_288 = 1.4930056;
        goto LAB_0011fefd;
      }
      bVar4 = false;
      _local_268 = _local_228;
      uVar19 = extraout_XMM1_Qa;
      auVar53 = _local_268;
    }
    _local_268 = auVar53;
  } while (bVar4);
  *(undefined1 (*) [8])this = local_268;
  *(undefined8 *)(this + 8) = uStack_260;
  VVar63.field_0._8_8_ = uVar19;
  VVar63.field_0._0_8_ = local_268;
  return (Vec3fa)VVar63.field_0;
}

Assistant:

Vec3fa renderPixel(const TutorialData& data, float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, data.accu_count);
  x += RandomSampler_get1D(sampler);
  y += RandomSampler_get1D(sampler);
  float time = RandomSampler_get1D(sampler);

  RayQueryContext context;
  InitIntersectionContext(&context);
  context.tutorialData = (void*) &data;

  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.context = &context.context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  Vec3fa color = Vec3fa(0.0f);
  Vec3fa weight = Vec3fa(1.0f);
  unsigned int depth = 0;

  while (true)
  {
    /* terminate ray path */
    if (reduce_max(weight) < 0.01f || depth > 20)
      return color;

    /* intersect ray with scene and gather all hits */
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
    RayStats_addRay(stats);

    /* exit if we hit environment */
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return color + weight*Vec3fa(data.ambient_intensity);

    /* calculate transmissivity of hair */
    AnisotropicBlinn brdf;
    float eps = 0.0001f;

    ISPCGeometry* geometry = data.ispc_scene->geometries[ray.geomID];
    if (geometry->type == CURVES)
    {
      /* calculate tangent space */
      const Vec3fa dx = normalize(ray.Ng);
      const Vec3fa dy = normalize(cross(ray.dir,dx));
      const Vec3fa dz = normalize(cross(dy,dx));

      /* generate anisotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,data.hair_Kr,data.hair_Kt,dx,20.0f,dy,2.0f,dz);
      brdf.Kr = data.hair_Kr;
    }
    else if (geometry->type == TRIANGLE_MESH)
    {
      if (dot(ray.dir,ray.Ng) > 0) ray.Ng = neg(ray.Ng);

      /* calculate tangent space */
      const Vec3fa dz = normalize(ray.Ng);
      const Vec3fa dx = normalize(cross(dz,ray.dir));
      const Vec3fa dy = normalize(cross(dz,dx));

      /* generate isotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,Vec3fa(1.0f),Vec3fa(0.0f),dx,1.0f,dy,1.0f,dz);
    }
    else
      return color;

    /* sample directional light */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(Vec3fa(data.dirlight_direction)), eps, inf, time);
    Vec3fa T = occluded(data.traversable,&context,shadow);
    RayStats_addShadowRay(stats);
    Vec3fa c = AnisotropicBlinn__eval(&brdf,neg(ray.dir),neg(Vec3fa(data.dirlight_direction)));
    color = color + weight*c*T*Vec3fa(data.dirlight_intensity);

#if 1
    /* sample BRDF */
    Vec3ff wi;
    float ru = RandomSampler_get1D(sampler);
    float rv = RandomSampler_get1D(sampler);
    float rw = RandomSampler_get1D(sampler);
    c = AnisotropicBlinn__sample(&brdf,neg(ray.dir),wi,ru,rv,rw);
    if (wi.w <= 0.0f) return color;

    /* calculate secondary ray and offset it out of the hair */
    float sign = dot(Vec3fa(wi),brdf.dz) < 0.0f ? -1.0f : 1.0f;
    ray.org = Vec3ff(ray.org + ray.tfar*ray.dir + sign*eps*brdf.dz);
    ray.dir = Vec3ff(wi);
    ray.tnear() = 0.001f;
    ray.tfar = inf;
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.primID = RTC_INVALID_GEOMETRY_ID;
    ray.mask = -1;
    ray.time() = time;
    weight = weight * c/wi.w;

#else

    /* continue with transparency ray */
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.tnear() = 1.001f*ray.tfar;
    ray.tfar = inf;
    weight *= brdf.Kt;

#endif

    depth++;
  }
  return color;
}